

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpinternalsourcedata.h
# Opt level: O0

void __thiscall jrtplib::RTPInternalSourceData::SentRTPPacket(RTPInternalSourceData *this)

{
  RTPTime local_18;
  RTPTime t;
  RTPInternalSourceData *this_local;
  
  if (((this->super_RTPSourceData).ownssrc & 1U) != 0) {
    t.m_t = (double)this;
    local_18 = RTPTime::CurrentTime();
    (this->super_RTPSourceData).issender = true;
    RTPSourceStats::SetLastRTPPacketTime(&(this->super_RTPSourceData).stats,&local_18);
    RTPSourceStats::SetLastMessageTime(&(this->super_RTPSourceData).stats,&local_18);
  }
  return;
}

Assistant:

void SentRTPPacket()										{ if (!ownssrc) return; RTPTime t = RTPTime::CurrentTime(); issender = true; stats.SetLastRTPPacketTime(t); stats.SetLastMessageTime(t); }